

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_deviate_mandatory(lys_deviate *deviate,lys_node *dev_target)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  lys_node *local_28;
  lys_node *parent;
  lys_node *dev_target_local;
  lys_deviate *deviate_local;
  
  if ((dev_target->nodetype & (LYS_ANYDATA|LYS_LEAF|LYS_CHOICE)) == LYS_UNKNOWN) {
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory");
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"mandatory\" property.");
    return 1;
  }
  if (deviate->mod == LY_DEVIATE_ADD) {
    if ((dev_target->flags & 0xc0) != 0) {
      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory");
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Adding property that already exists.");
      return 1;
    }
    if ((dev_target->nodetype == LYS_LEAF) && (dev_target[1].prev != (lys_node *)0x0)) {
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory","leaf");
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "The \"mandatory\" statement is forbidden on leaf with \"default\".");
      return 1;
    }
    if ((dev_target->nodetype == LYS_CHOICE) && (dev_target[1].dsc != (char *)0x0)) {
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory","choice");
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "The \"mandatory\" statement is forbidden on choices with \"default\".");
      return 1;
    }
  }
  else if ((dev_target->flags & 0xc0) == 0) {
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory");
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Replacing a property that does not exist.");
    return 1;
  }
  dev_target->flags = dev_target->flags & 0xff3f;
  dev_target->flags = dev_target->flags | deviate->flags & 0xc0;
  local_28 = dev_target->parent;
  while( true ) {
    bVar3 = false;
    if (local_28 != (lys_node *)0x0) {
      bVar3 = (local_28->nodetype & (LYS_ACTION|LYS_GROUPING|LYS_CHOICE)) == LYS_UNKNOWN;
    }
    if ((!bVar3) ||
       ((local_28->nodetype == LYS_CONTAINER &&
        (lVar1._0_2_ = local_28[1].flags, lVar1._2_1_ = local_28[1].ext_size,
        lVar1._3_1_ = local_28[1].iffeature_size, lVar1._4_1_ = local_28[1].padding[0],
        lVar1._5_1_ = local_28[1].padding[1], lVar1._6_1_ = local_28[1].padding[2],
        lVar1._7_1_ = local_28[1].padding[3], lVar1 != 0)))) break;
    local_28 = local_28->parent;
  }
  if ((local_28 != (lys_node *)0x0) &&
     (((local_28->nodetype == LYS_CHOICE && (local_28[1].dsc != (char *)0x0)) &&
      (iVar2 = lyp_check_mandatory_choice(local_28), iVar2 != 0)))) {
    return 1;
  }
  return 0;
}

Assistant:

int
yang_check_deviate_mandatory(struct lys_deviate *deviate, struct lys_node *dev_target)
{
    struct lys_node *parent;

    /* check target node type */
    if (!(dev_target->nodetype & (LYS_LEAF | LYS_CHOICE | LYS_ANYDATA))) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "mandatory");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"mandatory\" property.");
        goto error;
    }

    if (deviate->mod == LY_DEVIATE_ADD) {
        /* check that there is no current value */
        if (dev_target->flags & LYS_MAND_MASK) {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "mandatory");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Adding property that already exists.");
            goto error;
        } else {
            if (dev_target->nodetype == LYS_LEAF && ((struct lys_node_leaf *)dev_target)->dflt) {
                /* RFC 6020, 7.6.4 - default statement must not with mandatory true */
                LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "mandatory", "leaf");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "The \"mandatory\" statement is forbidden on leaf with \"default\".");
                goto error;
            } else if (dev_target->nodetype == LYS_CHOICE && ((struct lys_node_choice *)dev_target)->dflt) {
                LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "mandatory", "choice");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "The \"mandatory\" statement is forbidden on choices with \"default\".");
                goto error;
            }
        }
    } else { /* replace */
        if (!(dev_target->flags & LYS_MAND_MASK)) {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "mandatory");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Replacing a property that does not exist.");
            goto error;
        }
    }

    /* remove current mandatory value of the target ... */
    dev_target->flags &= ~LYS_MAND_MASK;

    /* ... and replace it with the value specified in deviation */
    dev_target->flags |= deviate->flags & LYS_MAND_MASK;

    /* check for mandatory node in default case, first find the closest parent choice to the changed node */
    for (parent = dev_target->parent;
         parent && !(parent->nodetype & (LYS_CHOICE | LYS_GROUPING | LYS_ACTION));
         parent = parent->parent) {
        if (parent->nodetype == LYS_CONTAINER && ((struct lys_node_container *)parent)->presence) {
            /* stop also on presence containers */
            break;
        }
    }
    /* and if it is a choice with the default case, check it for presence of a mandatory node in it */
    if (parent && parent->nodetype == LYS_CHOICE && ((struct lys_node_choice *)parent)->dflt) {
        if (lyp_check_mandatory_choice(parent)) {
            goto error;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}